

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

void __thiscall
QPDFFormFieldObjectHelper::setRadioButtonValue
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *name)

{
  string *warning;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 this_00;
  undefined8 uVar2;
  bool bVar3;
  __index_type _Var4;
  iterator key;
  iterator iVar5;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar6;
  iterator iVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  QPDFFormFieldObjectHelper ph;
  QPDFObjectHandle annot;
  QPDFObjectHandle parent;
  QPDFObjectHandle kids;
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  QPDFFormFieldObjectHelper local_150;
  QPDFObjectHandle local_118;
  undefined1 local_108 [32];
  undefined1 local_e8 [24];
  undefined1 local_d0 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  QPDFObjectHandle local_a8;
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  QPDFFormFieldObjectHelper *local_78;
  QPDFObjectHandle *local_70;
  QPDFObjectHandle local_68;
  Array local_58;
  QPDFObjectHandle local_40;
  
  local_170._0_8_ =
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_170._8_8_ =
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count + 1;
    }
  }
  p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&local_150.super_QPDFObjectHelper.super_BaseHandle.obj + 8);
  local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_160 + 0x10),"/Parent","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d0,(string *)local_170);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
    operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
  }
  bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_d0);
  if (bVar3) {
    local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_160 + 0x10),"/Parent","");
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_170,(string *)local_d0);
    bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_170);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
      operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 1);
    }
    if (bVar3) {
      local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_d0._0_8_;
      local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_d0._8_8_ + 8) = *(_Atomic_word *)(local_d0._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_d0._8_8_ + 8) = *(_Atomic_word *)(local_d0._8_8_ + 8) + 1;
        }
      }
      QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)(local_160 + 0x10),&local_88);
      if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      bVar3 = isRadioButton((QPDFFormFieldObjectHelper *)(local_160 + 0x10));
      if (bVar3) {
        local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (name->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (name->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_98.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_98.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_98.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_98.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        setRadioButtonValue((QPDFFormFieldObjectHelper *)(local_160 + 0x10),&local_98);
        if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        ~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)(local_160 + 0x10));
        goto LAB_0016b265;
      }
      ~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)(local_160 + 0x10));
    }
  }
  local_170._0_8_ =
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_170._8_8_ =
       (this->super_QPDFObjectHelper).super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count + 1;
    }
  }
  local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_160 + 0x10),"/Kids","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_d0 + 0x18),(string *)local_170);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
    operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
  }
  bVar3 = isRadioButton(this);
  if (((bVar3) && (bVar3 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_d0), bVar3)) &&
     (bVar3 = QPDFObjectHandle::isArray((QPDFObjectHandle *)(local_d0 + 0x18)), bVar3)) {
    local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_160 + 0x10),"/V","");
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (name->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (name->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    setFieldAttribute(this,(string *)(local_160 + 0x10),&local_a8);
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
      operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 1);
    }
    local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_d0._24_8_;
    local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_b0;
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
      }
    }
    local_58.sp_elements._M_t.
    super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    .
    super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
            )0x0;
    key = ::qpdf::Array::begin(&local_58);
    local_d0._16_8_ = name;
    local_78 = this;
    iVar5 = ::qpdf::Array::end(&local_58);
    if (key._M_current != iVar5._M_current) {
      warning = (string *)(local_160 + 0x10);
      local_70 = (QPDFObjectHandle *)iVar5;
      do {
        local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)warning,"/AP","");
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_108,(string *)key._M_current);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
          operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi + 1);
        }
        local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((element_type *)local_108._0_8_ == (element_type *)0x0) {
LAB_0016b40c:
          local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
          std::__cxx11::string::_M_construct<char_const*>((string *)warning,"/Kids","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_108 + 0x10),(string *)key._M_current);
          local_170._0_8_ = local_108._16_8_;
          local_170._8_8_ = local_108._24_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_ ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_160._0_8_ = 0;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_108._24_8_ + 8) = *(_Atomic_word *)(local_108._24_8_ + 8) + 1;
              UNLOCK();
              local_160._0_8_ = 0;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_ ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0016b4ba;
            }
            else {
              *(_Atomic_word *)(local_108._24_8_ + 8) = *(_Atomic_word *)(local_108._24_8_ + 8) + 1;
            }
            local_160._0_8_ = 0;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_);
          }
LAB_0016b4ba:
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
            operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 1);
          }
          iVar5 = ::qpdf::Array::begin((Array *)local_170);
          iVar7 = ::qpdf::Array::end((Array *)local_170);
          for (; iVar5._M_current != iVar7._M_current;
              iVar5._M_current = (QPDFObjectHandle *)&((string *)iVar5._M_current)->field_2) {
            local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
            std::__cxx11::string::_M_construct<char_const*>((string *)warning,"/AP","");
            QPDFObjectHandle::getKey
                      ((QPDFObjectHandle *)(local_108 + 0x10),(string *)iVar5._M_current);
            uVar2 = local_108._24_8_;
            local_108._0_8_ = local_108._16_8_;
            this_00 = local_108._8_8_;
            local_108._16_8_ = (element_type *)0x0;
            local_108._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_108._8_8_ = uVar2;
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_ !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_);
            }
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
              operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                              (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi + 1);
            }
            if ((element_type *)local_108._0_8_ != (element_type *)0x0) {
              _Var4 = *(__index_type *)(local_108._0_8_ + 0x30);
              if (_Var4 == '\x0f') {
                pvVar6 = std::
                         get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                   ((variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     *)local_108._0_8_);
LAB_0016b5a0:
                _Var4 = *(__index_type *)
                         ((long)&(((pvVar6->obj).
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                  )->value).
                                 super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 .
                                 super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                         + 0x30);
              }
              else if (_Var4 == '\r') {
                pvVar6 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                          *)QPDF::resolve(*(QPDF **)(local_108._0_8_ + 0x48),
                                          *(QPDFObjGen *)(local_108._0_8_ + 0x50));
                goto LAB_0016b5a0;
              }
              if (_Var4 != '\x02') {
                local_118.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)(((string *)iVar5._M_current)->_M_dataplus)._M_p;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&local_118.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                           (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &((string *)iVar5._M_current)->_M_string_length);
                break;
              }
            }
          }
          std::
          unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
          ::~unique_ptr((unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                         *)local_160);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
          }
        }
        else {
          _Var4 = *(__index_type *)(local_108._0_8_ + 0x30);
          if (_Var4 == '\x0f') {
            pvVar6 = std::
                     get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                               ((variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 *)local_108._0_8_);
LAB_0016b402:
            _Var4 = *(__index_type *)
                     ((long)&(((pvVar6->obj).
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             value).
                             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     + 0x30);
          }
          else if (_Var4 == '\r') {
            pvVar6 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                      *)QPDF::resolve(*(QPDF **)(local_108._0_8_ + 0x48),
                                      *(QPDFObjGen *)(local_108._0_8_ + 0x50));
            goto LAB_0016b402;
          }
          if (_Var4 == '\x02') goto LAB_0016b40c;
          local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)(((string *)key._M_current)->_M_dataplus)._M_p;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_118.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &((string *)key._M_current)->_M_string_length);
        }
        if (local_118.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0
           ) {
          local_170._0_8_ =
               (local_78->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_170._8_8_ =
               (local_78->super_QPDFObjectHelper).super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count +
                   1;
            }
          }
          local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)warning,"unable to set the value of this radio button","");
          QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_170,warning);
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
            operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
          }
        }
        else {
          bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_108);
          if (bVar3) {
            local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
            std::__cxx11::string::_M_construct<char_const*>((string *)warning,"/N","");
            QPDFObjectHandle::getKey(&local_40,(string *)local_108);
            bVar3 = QPDFObjectHandle::isDictionary(&local_40);
            if (bVar3) {
              local_170._0_8_ = local_160;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"/N","");
              QPDFObjectHandle::getKey(&local_68,(string *)local_108);
              QPDFObjectHandle::getName_abi_cxx11_
                        ((string *)(local_108 + 0x10),(QPDFObjectHandle *)local_d0._16_8_);
              bVar3 = QPDFObjectHandle::hasKey(&local_68,(string *)(local_108 + 0x10));
              if ((element_type *)local_108._16_8_ != (element_type *)local_e8) {
                operator_delete((void *)local_108._16_8_,local_e8._0_8_ + 1);
              }
              if (local_68.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_68.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
              if ((element_type *)local_170._0_8_ != (element_type *)local_160) {
                operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
              }
            }
            else {
              bVar3 = false;
            }
            if (local_40.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_40.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
              operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                              (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi + 1);
            }
            if (bVar3 == false) goto LAB_0016b79d;
            local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
            std::__cxx11::string::_M_construct<char_const*>((string *)warning,"/AS","");
            QPDFObjectHandle::replaceKey(&local_118,warning,(QPDFObjectHandle *)local_d0._16_8_);
          }
          else {
LAB_0016b79d:
            local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
            std::__cxx11::string::_M_construct<char_const*>((string *)warning,"/AS","");
            local_170._0_8_ = local_160;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"/Off","");
            QPDFObjectHandle::newName((QPDFObjectHandle *)(local_108 + 0x10),(string *)local_170);
            QPDFObjectHandle::replaceKey(&local_118,warning,(QPDFObjectHandle *)(local_108 + 0x10));
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._24_8_);
            }
            if ((element_type *)local_170._0_8_ != (element_type *)local_160) {
              operator_delete((void *)local_170._0_8_,local_160._0_8_ + 1);
            }
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
            operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 1);
          }
        }
        if ((QPDFObjGen)
            local_118.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (QPDFObjGen)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
        }
        key._M_current = (QPDFObjectHandle *)&((string *)key._M_current)->field_2;
      } while (key._M_current != local_70);
    }
    std::
    unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
    ::~unique_ptr(&local_58.sp_elements);
    this_01._M_pi =
         local_58.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  else {
    local_170._0_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_170._8_8_ =
         (this->super_QPDFObjectHelper).super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_)->_M_use_count + 1;
      }
    }
    local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_160 + 0x10),
               "don\'t know how to set the value of this field as a radio button","");
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_170,(string *)(local_160 + 0x10));
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
      operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                      (long)local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi + 1);
      this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_;
    }
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
LAB_0016b265:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
  }
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setRadioButtonValue(QPDFObjectHandle name)
{
    // Set the value of a radio button field. This has the following specific behavior:
    // * If this is a radio button field that has a parent that is also a radio button field and has
    //   no explicit /V, call itself on the parent
    // * If this is a radio button field with children, set /V to the given value. Then, for each
    //   child, if the child has the specified value as one of its keys in the /N subdictionary of
    //   its /AP (i.e. its normal appearance stream dictionary), set /AS to name; otherwise, if /Off
    //   is a member, set /AS to /Off.
    // Note that we never turn on /NeedAppearances when setting a radio button field.
    QPDFObjectHandle parent = oh().getKey("/Parent");
    if (parent.isDictionary() && parent.getKey("/Parent").isNull()) {
        QPDFFormFieldObjectHelper ph(parent);
        if (ph.isRadioButton()) {
            // This is most likely one of the individual buttons. Try calling on the parent.
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper set parent radio button");
            ph.setRadioButtonValue(name);
            return;
        }
    }

    QPDFObjectHandle kids = oh().getKey("/Kids");
    if (!(isRadioButton() && parent.isNull() && kids.isArray())) {
        oh().warnIfPossible("don't know how to set the value of this field as a radio button");
        return;
    }
    setFieldAttribute("/V", name);
    for (auto const& kid: kids.as_array()) {
        QPDFObjectHandle AP = kid.getKey("/AP");
        QPDFObjectHandle annot;
        if (AP.null()) {
            // The widget may be below. If there is more than one, just find the first one.
            for (auto const& grandkid: kid.getKey("/Kids").as_array()) {
                AP = grandkid.getKey("/AP");
                if (!AP.null()) {
                    QTC::TC("qpdf", "QPDFFormFieldObjectHelper radio button grandkid");
                    annot = grandkid;
                    break;
                }
            }
        } else {
            annot = kid;
        }
        if (!annot) {
            QTC::TC("qpdf", "QPDFObjectHandle broken radio button");
            oh().warnIfPossible("unable to set the value of this radio button");
            continue;
        }
        if (AP.isDictionary() && AP.getKey("/N").isDictionary() &&
            AP.getKey("/N").hasKey(name.getName())) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper turn on radio button");
            annot.replaceKey("/AS", name);
        } else {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper turn off radio button");
            annot.replaceKey("/AS", QPDFObjectHandle::newName("/Off"));
        }
    }
}